

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O3

void __thiscall
pfederc::Parser::parseClassConstructor
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *constructAttributes)

{
  short sVar1;
  pointer pPVar2;
  size_t sVar3;
  Token *pTVar4;
  size_t sVar5;
  _List_node_base **pp_Var6;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  _List_node_base *p_Var10;
  Lexer *pLVar11;
  pointer *__ptr;
  pointer __p;
  initializer_list<pfederc::Position> __l;
  undefined1 local_a8 [16];
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_98;
  _Base_ptr local_78;
  Error<pfederc::SyntaxErrorCode> *local_70;
  Token *local_68;
  Position local_48;
  
  local_68 = this->lexer->currentToken;
  Lexer::next(this->lexer);
  parseExpression((Parser *)local_a8,(Precedence)this);
  if (*(int *)&(((string *)(local_a8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
    local_78 = (_Base_ptr)constructAttributes;
    do {
      p_Var8 = local_78;
      uVar7 = local_a8._0_8_;
      if (*(_List_node_base **)local_a8._0_8_ != (_List_node_base *)&PTR__BiOpExpr_0012b990) {
        __cxa_bad_cast();
      }
      sVar1 = (short)((string *)(local_a8._0_8_ + 0x38))->_M_string_length;
      if (sVar1 != 0x2e) {
        if (sVar1 == 0x53) {
          local_a8._0_8_ = (Lexer *)0x0;
          local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)uVar7;
          p_Var10 = (_List_node_base *)operator_new(0x18);
          p_Var10[1]._M_next = (_List_node_base *)uVar7;
          local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          std::__detail::_List_node_base::_M_hook(p_Var10);
          p_Var8->_M_left = (_Base_ptr)((long)&p_Var8->_M_left->_M_color + 1);
          std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                     &local_98);
          goto LAB_001127c2;
        }
        break;
      }
      pPVar2 = *(pointer *)((long)&((string *)(local_a8._0_8_ + 0x38))->field_2 + 8);
      if (*(int *)&pPVar2[1].line == 0x12) {
        if ((_List_node_base *)pPVar2->line != (_List_node_base *)&PTR__BiOpExpr_0012b990) {
          __cxa_bad_cast();
        }
        if ((short)pPVar2[2].endIndex != 0x53) goto LAB_00112673;
        *(undefined8 *)((long)&((string *)(local_a8._0_8_ + 0x38))->field_2 + 8) = 0;
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = pPVar2;
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next =
             (_List_node_base *)
             local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        local_78->_M_left = (_Base_ptr)((long)&local_78->_M_left->_M_color + 1);
        std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                   &local_98);
        pLVar11 = (Lexer *)(((string *)(uVar7 + 0x38))->field_2)._M_allocated_capacity;
        (((string *)(uVar7 + 0x38))->field_2)._M_allocated_capacity = 0;
      }
      else {
LAB_00112673:
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
        p_Var10 = (_List_node_base *)pPVar2[2].line;
        ((Error<pfederc::SyntaxErrorCode> *)
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
        ((Error<pfederc::SyntaxErrorCode> *)
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_VARDECL;
        sVar3 = pPVar2[1].endIndex;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->pos).line = pPVar2[1].startIndex;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->pos).startIndex = sVar3;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->pos).endIndex = (size_t)p_Var10;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        generateError((Parser *)&stack0xffffffffffffffb0,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   &stack0xffffffffffffffb0);
        if ((Error<pfederc::SyntaxErrorCode> *)
            local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
            _M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_98,
                     (Error<pfederc::SyntaxErrorCode> *)
                     local_98.
                     super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        pLVar11 = (Lexer *)(((string *)(uVar7 + 0x38))->field_2)._M_allocated_capacity;
        (((string *)(uVar7 + 0x38))->field_2)._M_allocated_capacity = 0;
      }
      if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
        pp_Var6 = (_List_node_base **)local_a8._0_8_;
        local_a8._0_8_ = pLVar11;
        (*(code *)(*pp_Var6)->_M_prev)();
        pLVar11 = (Lexer *)local_a8._0_8_;
      }
      local_a8._0_8_ = pLVar11;
    } while (*(int *)&(((string *)(local_a8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12);
  }
  uVar7 = local_a8._0_8_;
  local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
  sVar3 = *(size_t *)((long)&((string *)(uVar7 + 0x18))->field_2 + 8);
  ((Error<pfederc::SyntaxErrorCode> *)
  local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
  ((Error<pfederc::SyntaxErrorCode> *)
  local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_VARDECL;
  sVar5 = (((string *)(uVar7 + 0x18))->field_2)._M_allocated_capacity;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->pos).line = ((string *)(uVar7 + 0x18))->_M_string_length;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->pos).startIndex = sVar5;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->pos).endIndex = sVar3;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->extraPos).
  super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->extraPos).
  super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->extraPos).
  super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generateError((Parser *)&stack0xffffffffffffffa8,
                (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)this);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
             &stack0xffffffffffffffa8);
  if ((Error<pfederc::SyntaxErrorCode> *)
      local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_98,
               (Error<pfederc::SyntaxErrorCode> *)
               local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001127c2:
  bVar9 = expect(this,TOK_BRACKET_CLOSE);
  if (!bVar9) {
    pTVar4 = this->lexer->currentToken;
    local_48.line = (local_68->pos).line;
    local_48.startIndex = (local_68->pos).startIndex;
    local_48.endIndex = (local_68->pos).endIndex;
    __l._M_len = 1;
    __l._M_array = &local_48;
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
              (&local_98,__l,(allocator_type *)(local_a8 + 0xf));
    local_70 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar3 = (pTVar4->pos).endIndex;
    local_70->logLevel = LVL_ERROR;
    local_70->err = STX_ERR_EXPECTED_CLOSING_BRACKET;
    sVar5 = (pTVar4->pos).startIndex;
    (local_70->pos).line = (pTVar4->pos).line;
    (local_70->pos).startIndex = sVar5;
    (local_70->pos).endIndex = sVar3;
    (local_70->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_70->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_70->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)&stack0xffffffffffffffa0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa0);
    if (local_70 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_70,local_70);
    }
    local_70 = (Error<pfederc::SyntaxErrorCode> *)0x0;
    if ((Error<pfederc::SyntaxErrorCode> *)
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      operator_delete(local_98.
                      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
    (*(code *)(*(_List_node_base **)local_a8._0_8_)->_M_prev)();
  }
  return;
}

Assistant:

void Parser::parseClassConstructor(bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &constructAttributes) noexcept {
  const Token *const constructStart = lexer.getCurrentToken();
  lexer.next();

  std::unique_ptr<Expr> expr(parseExpression());
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    if (!isBiOpExpr(biopexpr.getRight(), TokenType::TOK_OP_DCL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, biopexpr.getRight().getPosition()));
      // advance to next left expression
      expr = biopexpr.getLeftPtr();
      continue;
    }

    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(biopexpr.getRightPtr().release())));
    // advance to next left expression
    expr = biopexpr.getLeftPtr();
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, expr->getPosition()));
    // soft error
  } else {
    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(expr.release())));
  }

  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position>{ constructStart->getPosition() }));
  }
}